

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          format_decimal<wchar_t,unsigned_int,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *out,uint value,int num_digits,add_thousands_sep<wchar_t> sep)

{
  wchar_t *pwVar1;
  size_t __n;
  char_type buffer [13];
  wchar_t local_58 [16];
  
  if (-1 < num_digits) {
    pwVar1 = format_decimal<unsigned_int,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                       (local_58,value,num_digits,sep);
    __n = (long)pwVar1 - (long)local_58;
    if (__n != 0) {
      memcpy(out,local_58,__n);
    }
    return (wchar_t *)((long)out + __n);
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3dd,
                "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = wchar_t, UInt = unsigned int, Iterator = wchar_t *, ThousandsSep = fmt::internal::add_thousands_sep<wchar_t>]"
               );
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}